

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastArgumentsLdElemI(Lowerer *this,Instr *ldElem,LabelInstr *labelFallThru)

{
  Func *func;
  RegOpnd *indexOpnd;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  LabelInstr *instr;
  LabelInstr *notTaggedIntLabel;
  Instr *pIVar5;
  IntConstOpnd *actualParamOpnd;
  Opnd *pOVar6;
  undefined1 *puVar7;
  Lowerer *this_00;
  Lowerer *pLVar8;
  Lowerer *local_50;
  IntConstType value;
  Lowerer *local_40;
  bool local_32;
  char local_31;
  bool isNotInt;
  
  bVar2 = IR::Instr::DoStackArgsOpt(ldElem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5697,"(ldElem->DoStackArgsOpt())","ldElem->DoStackArgsOpt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = this;
  pIVar4 = IR::Opnd::AsIndirOpnd(ldElem->m_src1);
  local_31 = Func::IsInlinee(ldElem->m_func);
  func = ldElem->m_func;
  instr = IR::LabelInstr::New(Label,func,true);
  local_32 = false;
  local_50 = (Lowerer *)0x0;
  indexOpnd = pIVar4->m_indexOpnd;
  bVar2 = IR::IndirOpnd::TryGetIntConstIndexValue(pIVar4,true,(IntConstType *)&local_50,&local_32);
  if (local_32 != false) {
LAB_0056fe1e:
    puVar7 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar7 = 0x2a;
    __cxa_throw(puVar7,&Js::RejitException::typeinfo,0);
  }
  if ((bVar2) &&
     (((long)local_50 < 0 ||
      ((local_31 != '\0' && ((long)((ulong)ldElem->m_func->actualCount - 1) <= (long)local_50))))))
  {
    pOVar6 = LoadLibraryValueOpnd(local_40,ldElem,ValueUndefined);
    InsertMove(ldElem->m_dst,pOVar6,ldElem,true);
    InsertBranch(Br,labelFallThru,ldElem);
    return true;
  }
  if (labelFallThru == (LabelInstr *)0x0) goto LAB_0056fe1e;
  notTaggedIntLabel = IR::LabelInstr::New(Label,func,true);
  pLVar8 = local_40;
  if (local_31 == '\0') {
    pIVar5 = LowererMD::LoadInputParamCount(&local_40->m_lowererMD,ldElem,-1,false);
    value = (IntConstType)IR::Opnd::UseWithNewType(pIVar5->m_dst,TyInt32,pLVar8->m_func);
  }
  else {
    value = (IntConstType)
            IR::IntConstOpnd::New((ulong)ldElem->m_func->actualCount - 1,TyInt32,func,false);
  }
  pLVar8 = local_40;
  if (bVar2) {
    this_00 = local_50;
    actualParamOpnd = IR::IntConstOpnd::New((IntConstType)local_50,TyInt32,func,false);
    pLVar8 = local_40;
    if (local_31 != '\0') {
LAB_0056fd3b:
      pIVar4 = GetArgsIndirOpndForInlinee(pLVar8,ldElem,&actualParamOpnd->super_Opnd);
      goto LAB_0056fd6f;
    }
  }
  else {
    this_00 = (Lowerer *)&local_40->m_lowererMD;
    actualParamOpnd =
         (IntConstOpnd *)
         LowererMD::LoadNonnegativeIndex
                   ((LowererMD *)this_00,indexOpnd,(indexOpnd->super_Opnd).m_type == TyUint32,
                    notTaggedIntLabel,notTaggedIntLabel,ldElem);
    if (local_31 != '\0') {
      GenerateCheckForArgumentsLength
                (this_00,ldElem,notTaggedIntLabel,(Opnd *)actualParamOpnd,(Opnd *)value,BrGe_A);
      goto LAB_0056fd3b;
    }
  }
  GenerateCheckForArgumentsLength
            (this_00,ldElem,notTaggedIntLabel,(Opnd *)value,&actualParamOpnd->super_Opnd,BrLe_A);
  pIVar4 = GetArgsIndirOpndForTopFunction(pLVar8,ldElem,&actualParamOpnd->super_Opnd);
LAB_0056fd6f:
  InsertMove(ldElem->m_dst,&pIVar4->super_Opnd,ldElem,true);
  InsertBranch(Br,labelFallThru,ldElem);
  IR::Instr::InsertBefore(ldElem,&notTaggedIntLabel->super_Instr);
  pOVar6 = LoadLibraryValueOpnd(pLVar8,ldElem,ValueUndefined);
  InsertMove(ldElem->m_dst,pOVar6,ldElem,true);
  InsertBranch(Br,labelFallThru,ldElem);
  IR::Instr::InsertBefore(ldElem,&instr->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastArgumentsLdElemI(IR::Instr* ldElem, IR::LabelInstr *labelFallThru)
{
    //  ---GenerateSmIntTest
    //  ---GenerateLdValueFromCheckedIndexOpnd
    //  ---LoadInputParamCount
    //  CMP actualParamOpnd, valueOpnd //Compare between the actual count & the index count (say i in arguments[i])
    //  JLE $labelReturnUndefined
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //  JMP $fallthrough
    //
    //labelReturnUndefined:
    //  MOV dst, undefined
    //  JMP $fallthrough
    //
    //labelCreateHeapArgs:
    //  ---Bail out to create Heap Arguments object

    Assert(ldElem->DoStackArgsOpt());

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    bool isInlinee = ldElem->m_func->IsInlinee();
    Func *func = ldElem->m_func;

    IR::LabelInstr *labelCreateHeapArgs = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // Now load the index and check if it is an integer.
    bool emittedFastPath = false;
    bool isNotInt = false;
    IntConstType   value = 0;
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd      *valueOpnd = nullptr;
    IR::Opnd      *actualParamOpnd = nullptr;

    bool hasIntConstIndex = indirOpnd->TryGetIntConstIndexValue(true, &value, &isNotInt);

    if (isNotInt)
    {
        //Not an int disable optimisation and rejit
    }
    else if (hasIntConstIndex && (value < 0 || (isInlinee && value >= (ldElem->m_func->actualCount - 1))))
    {
        // if the index is an int const outside the range then the value must be undefined
        // this is ensured as GlobOpt::OptArguments disables the Arguments optimisation if the arguments object is modified
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
        emittedFastPath = true;
    }
    else if (labelFallThru != nullptr)
    {
        IR::LabelInstr *labelReturnUndefined = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        if (isInlinee)
        {
            actualParamOpnd = IR::IntConstOpnd::New(ldElem->m_func->actualCount - 1, TyInt32, func);
        }
        else
        {
            // Load actuals count, LoadHeapArguments will reuse the generated instructions here
            IR::Instr      *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldElem, -1 /* don't include 'this' while counting actuals. */);
            actualParamOpnd = loadInputParamCountInstr->GetDst()->UseWithNewType(TyInt32,this->m_func);
        }

        if (hasIntConstIndex)
        {
            //Constant index
            valueOpnd = IR::IntConstOpnd::New(value, TyInt32, func);
        }
        else
        {
            //Load valueOpnd from the index, note this operation includes a bail-out for non-integer indices
            valueOpnd =
                m_lowererMD.LoadNonnegativeIndex(
                    indexOpnd,
                    (
#if INT32VAR
                        indexOpnd->GetType() == TyUint32
#else
                        // On 32-bit platforms, skip the negative check since for now, the unsigned upper bound check covers it
                        true
#endif
                        ),
                    labelReturnUndefined,
                    labelReturnUndefined,
                    ldElem);
        }

        if (isInlinee)
        {
            if (!hasIntConstIndex)
            {
                //Runtime check to make sure length is within the arguments.length range.
                GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, valueOpnd, actualParamOpnd, Js::OpCode::BrGe_A);
            }
        }
        else
        {
            GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, actualParamOpnd, valueOpnd, Js::OpCode::BrLe_A);
        }

        IR::Opnd *argIndirOpnd = nullptr;
        if (isInlinee)
        {
            argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, valueOpnd);
        }
        else
        {
            argIndirOpnd = GetArgsIndirOpndForTopFunction(ldElem, valueOpnd);
        }

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // if load is outside of range at runtime return false
        ldElem->InsertBefore(labelReturnUndefined);
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // $labelCreateHeapArgs:
        ldElem->InsertBefore(labelCreateHeapArgs);
        emittedFastPath = true;
    }

    if (!emittedFastPath)
    {
        throw Js::RejitException(RejitReason::DisableStackArgOpt);
    }

    return emittedFastPath;
}